

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O3

void tidyBufCheckAlloc(TidyBuffer *buf,uint allocSize,uint chunkSize)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  TidyAllocator *pTVar4;
  
  if (buf != (TidyBuffer *)0x0) {
    pTVar4 = buf->allocator;
    if (pTVar4 == (TidyAllocator *)0x0) {
      pTVar4 = &prvTidyg_default_allocator;
      buf->allocator = &prvTidyg_default_allocator;
    }
    uVar2 = buf->allocated;
    if (uVar2 < allocSize + 1) {
      uVar1 = 0x100;
      if (chunkSize != 0) {
        uVar1 = chunkSize;
      }
      if (uVar2 != 0) {
        uVar1 = uVar2;
      }
      do {
        uVar2 = uVar1;
        uVar1 = uVar2 * 2;
      } while (uVar2 < allocSize + 1);
      pbVar3 = (byte *)(*pTVar4->vtbl->realloc)(pTVar4,buf->bp,(size_t)uVar2);
      if (pbVar3 != (byte *)0x0) {
        memset(pbVar3 + buf->allocated,0,(ulong)(uVar2 - buf->allocated));
        buf->bp = pbVar3;
        buf->allocated = uVar2;
      }
    }
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0x75,"void tidyBufCheckAlloc(TidyBuffer *, uint, uint)");
}

Assistant:

void TIDY_CALL tidyBufCheckAlloc( TidyBuffer* buf, uint allocSize, uint chunkSize )
{
    assert( buf != NULL );

    if ( !buf->allocator )
        setDefaultAllocator( buf );
        
    if ( 0 == chunkSize )
        chunkSize = 256;
    if ( allocSize+1 > buf->allocated )
    {
        byte* bp;
        uint allocAmt = chunkSize;
        if ( buf->allocated > 0 )
            allocAmt = buf->allocated;
        while ( allocAmt < allocSize+1 )
            allocAmt *= 2;

        bp = (byte*)TidyRealloc( buf->allocator, buf->bp, allocAmt );
        if ( bp != NULL )
        {
            TidyClearMemory( bp + buf->allocated, allocAmt - buf->allocated );
            buf->bp = bp;
            buf->allocated = allocAmt;
        }
    }
}